

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Struct.hpp
# Opt level: O3

void __thiscall
Reflection::StructImpl<Sinclair::ZXSpectrum::State>::declare_emplace<unsigned_char>
          (StructImpl<Sinclair::ZXSpectrum::State> *this,uchar *t,string *name,size_t count)

{
  pointer pcVar1;
  long *local_60 [2];
  long local_50 [2];
  undefined *local_40;
  long local_38;
  undefined8 local_30;
  size_t local_28;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,pcVar1,pcVar1 + name->_M_string_length);
  local_40 = &unsigned_char::typeinfo;
  local_30 = 1;
  local_38 = (long)t - (long)this;
  local_28 = count;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Reflection::StructImpl<Sinclair::ZXSpectrum::State>::Field>,std::allocator<std::pair<std::__cxx11::string_const,Reflection::StructImpl<Sinclair::ZXSpectrum::State>::Field>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string,Reflection::StructImpl<Sinclair::ZXSpectrum::State>::Field>>
            (&contents__abi_cxx11_,(string *)local_60);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  return;
}

Assistant:

void declare_emplace(Type *t, const std::string &name, size_t count = 1) {
			contents_.emplace(
				std::make_pair(
					name,
					Field(typeid(Type), reinterpret_cast<uint8_t *>(t) - reinterpret_cast<uint8_t *>(this), sizeof(Type), count)
				));
		}